

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

uint8_t * __thiscall
CoreML::Specification::Metadata::_InternalSerialize
          (Metadata *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  string *psVar6;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pMVar7;
  size_type sVar8;
  MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **__p;
  type ppMVar9;
  type ppMVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  const_pointer pvVar12;
  const_reference pvVar13;
  void *data;
  const_iterator local_b8;
  undefined1 local_a0 [8];
  const_iterator it_1;
  size_type i;
  const_iterator local_78;
  undefined1 local_50 [8];
  const_iterator it;
  size_type n;
  unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*[]>_>
  items;
  uint32_t cached_has_bits;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  Metadata *this_local;
  
  items._M_t.
  super___uniq_ptr_impl<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*[]>_>
  .
  super__Head_base<0UL,_const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_false>
  ._M_head_impl._4_4_ = 0;
  _internal_shortdescription_abi_cxx11_(this);
  uVar4 = std::__cxx11::string::empty();
  stream_local = (EpsCopyOutputStream *)target;
  if ((uVar4 & 1) == 0) {
    _internal_shortdescription_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    _internal_shortdescription_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar5,iVar3,SERIALIZE,"CoreML.Specification.Metadata.shortDescription");
    psVar6 = _internal_shortdescription_abi_cxx11_(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,1,psVar6,target);
  }
  _internal_versionstring_abi_cxx11_(this);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    _internal_versionstring_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    _internal_versionstring_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar5,iVar3,SERIALIZE,"CoreML.Specification.Metadata.versionString");
    psVar6 = _internal_versionstring_abi_cxx11_(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,2,psVar6,(uint8_t *)stream_local);
  }
  _internal_author_abi_cxx11_(this);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    _internal_author_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    _internal_author_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar5,iVar3,SERIALIZE,"CoreML.Specification.Metadata.author");
    psVar6 = _internal_author_abi_cxx11_(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,3,psVar6,(uint8_t *)stream_local);
  }
  _internal_license_abi_cxx11_(this);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    _internal_license_abi_cxx11_(this);
    pcVar5 = (char *)std::__cxx11::string::data();
    _internal_license_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              (pcVar5,iVar3,SERIALIZE,"CoreML.Specification.Metadata.license");
    psVar6 = _internal_license_abi_cxx11_(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                             (stream,4,psVar6,(uint8_t *)stream_local);
  }
  pMVar7 = _internal_userdefined_abi_cxx11_(this);
  bVar2 = google::protobuf::
          Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::empty(pMVar7);
  if (!bVar2) {
    bVar2 = google::protobuf::io::EpsCopyOutputStream::IsSerializationDeterministic(stream);
    if (bVar2) {
      pMVar7 = _internal_userdefined_abi_cxx11_(this);
      sVar8 = google::protobuf::
              Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::size(pMVar7);
      if (1 < sVar8) {
        pMVar7 = _internal_userdefined_abi_cxx11_(this);
        sVar8 = google::protobuf::
                Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::size(pMVar7);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = sVar8;
        uVar4 = SUB168(auVar1 * ZEXT816(8),0);
        if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
          uVar4 = 0xffffffffffffffff;
        }
        __p = (MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               **)operator_new__(uVar4);
        std::
        unique_ptr<google::protobuf::MapPair<std::__cxx11::string,std::__cxx11::string>const*[],std::default_delete<google::protobuf::MapPair<std::__cxx11::string,std::__cxx11::string>const*[]>>
        ::
        unique_ptr<google::protobuf::MapPair<std::__cxx11::string,std::__cxx11::string>const**,std::default_delete<google::protobuf::MapPair<std::__cxx11::string,std::__cxx11::string>const*[]>,void,bool>
                  ((unique_ptr<google::protobuf::MapPair<std::__cxx11::string,std::__cxx11::string>const*[],std::default_delete<google::protobuf::MapPair<std::__cxx11::string,std::__cxx11::string>const*[]>>
                    *)&n,__p);
        it.it_.bucket_index_ = 0;
        pMVar7 = _internal_userdefined_abi_cxx11_(this);
        google::protobuf::
        Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::begin((const_iterator *)local_50,pMVar7);
        while( true ) {
          pMVar7 = _internal_userdefined_abi_cxx11_(this);
          google::protobuf::
          Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::end(&local_78,pMVar7);
          bVar2 = google::protobuf::operator!=((const_iterator *)local_50,&local_78);
          if (!bVar2) break;
          pvVar13 = google::protobuf::
                    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::const_iterator::operator*((const_iterator *)local_50);
          ppMVar9 = std::
                    unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*[]>_>
                    ::operator[]((unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*[]>_>
                                  *)&n,it.it_.bucket_index_);
          *ppMVar9 = pvVar13;
          google::protobuf::
          Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::const_iterator::operator++((const_iterator *)local_50);
          it.it_.bucket_index_ = it.it_.bucket_index_ + 1;
        }
        ppMVar9 = std::
                  unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*[]>_>
                  ::operator[]((unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*[]>_>
                                *)&n,0);
        ppMVar10 = std::
                   unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*[]>_>
                   ::operator[]((unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*[]>_>
                                 *)&n,it.it_.bucket_index_);
        std::
        sort<google::protobuf::MapPair<std::__cxx11::string,std::__cxx11::string>const**,google::protobuf::internal::CompareByDerefFirst<google::protobuf::MapPair<std::__cxx11::string,std::__cxx11::string>const*>>
                  (ppMVar9,ppMVar10);
        for (it_1.it_.bucket_index_ = 0; it_1.it_.bucket_index_ < it.it_.bucket_index_;
            it_1.it_.bucket_index_ = it_1.it_.bucket_index_ + 1) {
          ppMVar9 = std::
                    unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*[]>_>
                    ::operator[]((unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*[]>_>
                                  *)&n,it_1.it_.bucket_index_);
          pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*ppMVar9;
          ppMVar9 = std::
                    unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*[]>_>
                    ::operator[]((unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*[]>_>
                                  *)&n,it_1.it_.bucket_index_);
          stream_local = (EpsCopyOutputStream *)
                         google::protobuf::internal::
                         MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
                         ::InternalSerialize(100,pbVar11,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)(*ppMVar9 + 0x20),(uint8_t *)stream_local,stream);
          ppMVar9 = std::
                    unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*[]>_>
                    ::operator[]((unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*[]>_>
                                  *)&n,it_1.it_.bucket_index_);
          _InternalSerialize(unsigned_char*,google::protobuf::io::EpsCopyOutputStream*)::
          string_>_const__(*ppMVar9);
        }
        std::
        unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*[]>_>
        ::~unique_ptr((unique_ptr<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*[],_std::default_delete<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*[]>_>
                       *)&n);
        goto LAB_0029f983;
      }
    }
    pMVar7 = _internal_userdefined_abi_cxx11_(this);
    google::protobuf::
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::begin((const_iterator *)local_a0,pMVar7);
    while( true ) {
      pMVar7 = _internal_userdefined_abi_cxx11_(this);
      google::protobuf::
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::end(&local_b8,pMVar7);
      bVar2 = google::protobuf::operator!=((const_iterator *)local_a0,&local_b8);
      if (!bVar2) break;
      pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                google::protobuf::
                Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::const_iterator::operator->((const_iterator *)local_a0);
      pvVar12 = google::protobuf::
                Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::const_iterator::operator->((const_iterator *)local_a0);
      stream_local = (EpsCopyOutputStream *)
                     google::protobuf::internal::
                     MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)9>
                     ::InternalSerialize(100,pbVar11,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)(pvVar12 + 0x20),(uint8_t *)stream_local,stream);
      pvVar13 = google::protobuf::
                Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::const_iterator::operator*((const_iterator *)local_a0);
      _InternalSerialize(unsigned_char*,google::protobuf::io::EpsCopyOutputStream*)::
      string_>_const__(pvVar13);
      google::protobuf::
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::const_iterator::operator++((const_iterator *)local_a0);
    }
  }
LAB_0029f983:
  bVar2 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar2) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    data = (void *)std::__cxx11::string::data();
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    iVar3 = std::__cxx11::string::size();
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRaw
                             (stream,data,iVar3,(uint8_t *)stream_local);
  }
  return (uint8_t *)stream_local;
}

Assistant:

uint8_t* Metadata::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.Metadata)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // string shortDescription = 1;
  if (!this->_internal_shortdescription().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_shortdescription().data(), static_cast<int>(this->_internal_shortdescription().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.Metadata.shortDescription");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_shortdescription(), target);
  }

  // string versionString = 2;
  if (!this->_internal_versionstring().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_versionstring().data(), static_cast<int>(this->_internal_versionstring().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.Metadata.versionString");
    target = stream->WriteStringMaybeAliased(
        2, this->_internal_versionstring(), target);
  }

  // string author = 3;
  if (!this->_internal_author().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_author().data(), static_cast<int>(this->_internal_author().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.Metadata.author");
    target = stream->WriteStringMaybeAliased(
        3, this->_internal_author(), target);
  }

  // string license = 4;
  if (!this->_internal_license().empty()) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
      this->_internal_license().data(), static_cast<int>(this->_internal_license().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.Metadata.license");
    target = stream->WriteStringMaybeAliased(
        4, this->_internal_license(), target);
  }

  // map<string, string> userDefined = 100;
  if (!this->_internal_userdefined().empty()) {
    typedef ::PROTOBUF_NAMESPACE_ID::Map< std::string, std::string >::const_pointer
        ConstPtr;
    typedef ConstPtr SortItem;
    typedef ::PROTOBUF_NAMESPACE_ID::internal::CompareByDerefFirst<SortItem> Less;
    struct Utf8Check {
      static void Check(ConstPtr p) {
        (void)p;
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
          p->first.data(), static_cast<int>(p->first.length()),
          ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
          "CoreML.Specification.Metadata.UserDefinedEntry.key");
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::VerifyUtf8String(
          p->second.data(), static_cast<int>(p->second.length()),
          ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::SERIALIZE,
          "CoreML.Specification.Metadata.UserDefinedEntry.value");
      }
    };

    if (stream->IsSerializationDeterministic() &&
        this->_internal_userdefined().size() > 1) {
      ::std::unique_ptr<SortItem[]> items(
          new SortItem[this->_internal_userdefined().size()]);
      typedef ::PROTOBUF_NAMESPACE_ID::Map< std::string, std::string >::size_type size_type;
      size_type n = 0;
      for (::PROTOBUF_NAMESPACE_ID::Map< std::string, std::string >::const_iterator
          it = this->_internal_userdefined().begin();
          it != this->_internal_userdefined().end(); ++it, ++n) {
        items[static_cast<ptrdiff_t>(n)] = SortItem(&*it);
      }
      ::std::sort(&items[0], &items[static_cast<ptrdiff_t>(n)], Less());
      for (size_type i = 0; i < n; i++) {
        target = Metadata_UserDefinedEntry_DoNotUse::Funcs::InternalSerialize(100, items[static_cast<ptrdiff_t>(i)]->first, items[static_cast<ptrdiff_t>(i)]->second, target, stream);
        Utf8Check::Check(&(*items[static_cast<ptrdiff_t>(i)]));
      }
    } else {
      for (::PROTOBUF_NAMESPACE_ID::Map< std::string, std::string >::const_iterator
          it = this->_internal_userdefined().begin();
          it != this->_internal_userdefined().end(); ++it) {
        target = Metadata_UserDefinedEntry_DoNotUse::Funcs::InternalSerialize(100, it->first, it->second, target, stream);
        Utf8Check::Check(&(*it));
      }
    }
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.Metadata)
  return target;
}